

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task20.cpp
# Opt level: O0

void bubble_sort(int *arr,int size)

{
  int local_20;
  int local_1c;
  int ind2;
  int ind1;
  int unsort_size;
  int size_local;
  int *arr_local;
  
  for (ind2 = size; ind2 != 0; ind2 = ind2 + -1) {
    local_20 = 0;
    for (local_1c = 1; local_1c < ind2; local_1c = local_1c + 1) {
      if (arr[local_1c] < arr[local_20]) {
        std::swap<int>(arr + local_20,arr + local_1c);
      }
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void bubble_sort (int* arr, int size){
    for (int unsort_size = size; unsort_size; unsort_size--)
        for (int ind1 = 1, ind2 = 0; ind1 < unsort_size; ind1++, ind2++)
            if (arr[ind2] > arr[ind1]) swap(arr[ind2], arr[ind1]);
}